

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenEM64T.cpp
# Opt level: O1

void Centaurus::MatchRoutineEM64T<wchar_t>::emit
               (X86Assembler *as,MyConstPool *pool,Label *rejectlabel,
               basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *str)

{
  bool bVar1;
  ulong uVar2;
  ulong uVar3;
  int i;
  int iVar4;
  ulong uVar5;
  UInt64 UVar6;
  undefined1 auVar8 [16];
  undefined1 auVar9 [32];
  size_t offset;
  Data128 d1;
  anon_union_16_7_ed616b9d_for_Operand__0 local_98;
  Operand_ *local_88;
  Operand_ *local_80;
  undefined8 local_78;
  Operand_ *local_70;
  ConstPool *local_68;
  MyConstPool *local_60;
  anon_union_16_7_ed616b9d_for_Operand__0 local_58;
  uint32_t local_48 [2];
  UInt64 local_40;
  anon_union_8_2_78723da6_for_MemData_2 aStack_38;
  undefined1 auVar7 [16];
  
  uVar5 = str->_M_string_length;
  local_88 = (Operand_ *)rejectlabel;
  if (uVar5 < 8) {
    if (uVar5 != 0) {
      uVar5 = 0;
      do {
        local_98._packed[0] = (UInt64)1.65781168201985e-316;
        local_98._mem.field_2 = (anon_union_8_2_78723da6_for_MemData_2)0x600000000;
        asmjit::CodeEmitter::emit
                  ((CodeEmitter *)as,0x1ad,(Operand_ *)(asmjit::x86OpData + 0x480),
                   (Operand_ *)&local_98._any);
        asmjit::CodeEmitter::emit((CodeEmitter *)as,7,(Operand_ *)(asmjit::x86OpData + 0x4e0),2);
        asmjit::CodeEmitter::emit
                  ((CodeEmitter *)as,0x67,(Operand_ *)(asmjit::x86OpData + 0x480),
                   (str->_M_dataplus)._M_p[uVar5]);
        asmjit::CodeEmitter::emit((CodeEmitter *)as,0x124,local_88);
        uVar5 = uVar5 + 1;
      } while (uVar5 < str->_M_string_length);
    }
  }
  else {
    local_68 = &pool->m_pool;
    uVar2 = 0;
    local_70 = (Operand_ *)(asmjit::x86OpData + 0x4e0);
    local_78 = 0x1786e8;
    local_80 = (Operand_ *)(asmjit::x86OpData + 0x490);
    iVar4 = 0;
    local_60 = pool;
    do {
      uVar3 = uVar5 - uVar2;
      if (3 < uVar3) {
        uVar3 = 4;
      }
      if (uVar5 != uVar2) {
        auVar9 = vpbroadcastq_avx512vl();
        uVar5 = vpcmpuq_avx512vl(auVar9,_DAT_00168320,5);
        uVar5 = uVar5 & 0xf;
        auVar7 = vmovdqu32_avx512vl(*(undefined1 (*) [16])((str->_M_dataplus)._M_p + iVar4));
        auVar8._4_4_ = (uint)((byte)(uVar5 >> 1) & 1) * auVar7._4_4_;
        auVar8._0_4_ = (uint)((byte)uVar5 & 1) * auVar7._0_4_;
        auVar8._8_4_ = (uint)((byte)(uVar5 >> 2) & 1) * auVar7._8_4_;
        auVar8._12_4_ = (uint)(byte)(uVar5 >> 3) * auVar7._12_4_;
        auVar7 = vpmovdw_avx512vl(auVar8);
        bVar1 = (bool)((byte)uVar5 & 1);
        UVar6._0_2_ = (ushort)bVar1 * auVar7._0_2_ | (ushort)!bVar1 * local_40.i16[0];
        bVar1 = (bool)((byte)(uVar5 >> 1) & 1);
        UVar6._2_2_ = (ushort)bVar1 * auVar7._2_2_ | (ushort)!bVar1 * local_40.i16[1];
        bVar1 = (bool)((byte)(uVar5 >> 2) & 1);
        UVar6._4_2_ = (ushort)bVar1 * auVar7._4_2_ | (ushort)!bVar1 * local_40.i16[2];
        bVar1 = SUB81(uVar5 >> 3,0);
        UVar6._6_2_ = (ushort)bVar1 * auVar7._6_2_ | (ushort)!bVar1 * local_40.i16[3];
        local_40 = UVar6;
      }
      local_98._packed[0] = (UInt64)0x32;
      local_98._mem.field_2 = (anon_union_8_2_78723da6_for_MemData_2)0x600000000;
      asmjit::CodeEmitter::emit
                ((CodeEmitter *)as,0x191,(Operand_ *)(asmjit::x86OpData + 0x700),
                 (Operand_ *)&local_98._any);
      local_98._packed[0] = local_40;
      local_98._mem.field_2 = aStack_38;
      asmjit::ConstPool::add(local_68,&local_98,0x10,(size_t *)local_48);
      local_58._packed[0].i64 = (UInt64)0xa;
      local_58._any.reserved12_4 = (local_60->m_label).super_Operand.super_Operand_.field_0._any.id;
      local_58._any.reserved8_4 = local_48[0];
      local_98._packed[0] = (UInt64)0x3;
      local_98._mem.field_2 = (anon_union_8_2_78723da6_for_MemData_2)0x19;
      asmjit::CodeEmitter::emit
                ((CodeEmitter *)as,0x1e1,(Operand_ *)(asmjit::x86OpData + 0x700),
                 (Operand_ *)&local_58._any,(Operand_ *)&local_98._any);
      local_98._packed[0] = (UInt64)0x3;
      local_98._8_8_ = uVar3;
      asmjit::CodeEmitter::emit((CodeEmitter *)as,0x67,local_80,(Operand_ *)&local_98._any);
      asmjit::CodeEmitter::emit((CodeEmitter *)as,0x115,local_88);
      asmjit::CodeEmitter::emit((CodeEmitter *)as,7,local_70,(int)uVar3);
      iVar4 = iVar4 + 4;
      uVar2 = (ulong)iVar4;
      uVar5 = str->_M_string_length;
    } while (uVar2 < uVar5);
  }
  return;
}

Assistant:

void MatchRoutineEM64T<TCHAR>::emit(asmjit::X86Assembler& as, MyConstPool& pool, asmjit::Label& rejectlabel, const std::basic_string<TCHAR>& str)
{
    if (str.size() < 8)
    {
        for (int i = 0; i < str.size(); i++)
        {
            if (sizeof(TCHAR) == 1)
            {
                as.movzx(CHAR_REG, asmjit::x86::byte_ptr(INPUT_REG, 0));
                as.inc(INPUT_REG);
            }
            else
            {
                as.movzx(CHAR_REG, asmjit::x86::word_ptr(INPUT_REG, 0));
                as.add(INPUT_REG, 2);
            }
            as.cmp(CHAR_REG, str[i]);
            as.jne(rejectlabel);
        }
    }
    else
    {
        for (int i = 0; i < str.size(); i += 16 / sizeof(TCHAR))
        {
            int l1 = std::min(str.size() - i, (size_t)(16 / sizeof(TCHAR)));

            asmjit::Data128 d1;

            for (int j = 0; j < l1; j++)
            {
                if (sizeof(TCHAR) == 1)
                    d1.ub[j] = str[i + j];
                else
                    d1.uw[j] = str[i + j];
            }

            as.movdqu(LOAD_REG, asmjit::X86Mem(INPUT_REG, 0));
            as.pcmpistri(LOAD_REG, pool.add(d1), asmjit::Imm(sizeof(TCHAR) == 1 ? 0x18 : 0x19));
            as.cmp(INDEX_REG, asmjit::Imm(l1));
            as.jb(rejectlabel);
            as.add(INPUT_REG, l1);
        }
    }
}